

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::cpp_function::destruct(function_record *rec)

{
  function_record *pfVar1;
  pointer paVar2;
  argument_record *arg;
  pointer paVar3;
  
  while (rec != (function_record *)0x0) {
    pfVar1 = rec->next;
    if (rec->free_data != (_func_void_function_record_ptr *)0x0) {
      (*rec->free_data)(rec);
    }
    free(rec->name);
    free(rec->doc);
    free(rec->signature);
    paVar2 = (rec->args).
             super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar3 = (rec->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar2;
        paVar3 = paVar3 + 0x20) {
      free(*(void **)paVar3);
      free(*(void **)(paVar3 + 8));
      handle::dec_ref((handle *)(paVar3 + 0x10));
    }
    if (rec->def != (PyMethodDef *)0x0) {
      free(rec->def->ml_doc);
      operator_delete(rec->def,0x20);
    }
    std::
    _Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
    ::~_Vector_base(&(rec->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   );
    operator_delete(rec,0x80);
    rec = pfVar1;
  }
  return;
}

Assistant:

static void destruct(detail::function_record *rec) {
        while (rec) {
            detail::function_record *next = rec->next;
            if (rec->free_data)
                rec->free_data(rec);
            std::free((char *) rec->name);
            std::free((char *) rec->doc);
            std::free((char *) rec->signature);
            for (auto &arg: rec->args) {
                std::free(const_cast<char *>(arg.name));
                std::free(const_cast<char *>(arg.descr));
                arg.value.dec_ref();
            }
            if (rec->def) {
                std::free(const_cast<char *>(rec->def->ml_doc));
                delete rec->def;
            }
            delete rec;
            rec = next;
        }
    }